

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_decoder.c
# Opt level: O3

lzma_ret alone_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  lzma_options_lzma *options;
  _Bool _Var1;
  uint uVar2;
  lzma_ret lVar3;
  ulong uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  lzma_filter_info filters [2];
  
  lVar3 = LZMA_OK;
  if (*out_pos < out_size) {
    iVar6 = *(int *)((long)coder_ptr + 0x48);
    if (iVar6 != 4) {
      options = (lzma_options_lzma *)((long)coder_ptr + 0x70);
      do {
        uVar8 = *in_pos;
        if (in_size <= uVar8) {
          return LZMA_OK;
        }
        switch(iVar6) {
        case 0:
          _Var1 = lzma_lzma_lclppb_decode(options,in[uVar8]);
          if (_Var1) {
            return LZMA_FORMAT_ERROR;
          }
          *(undefined4 *)((long)coder_ptr + 0x48) = 1;
          *in_pos = uVar8 + 1;
          iVar6 = 1;
          break;
        case 1:
          uVar2 = (uint)in[uVar8] << ((char)*(long *)((long)coder_ptr + 0x50) * '\b' & 0x3fU) |
                  *(uint *)((long)coder_ptr + 0x70);
          *(uint *)((long)coder_ptr + 0x70) = uVar2;
          lVar9 = *(long *)((long)coder_ptr + 0x50) + 1;
          *(long *)((long)coder_ptr + 0x50) = lVar9;
          iVar6 = 1;
          if (lVar9 == 4) {
            if (((*(char *)((long)coder_ptr + 0x4c) == '\x01') && (uVar2 != 0xffffffff)) &&
               (uVar7 = uVar2 - 1 >> 2 | uVar2 - 1, uVar7 = uVar7 >> 3 | uVar7,
               uVar7 = uVar7 >> 4 | uVar7, uVar7 = uVar7 >> 8 | uVar7,
               (uVar7 >> 0x10 | uVar7) + 1 != uVar2)) {
              return LZMA_FORMAT_ERROR;
            }
            *(undefined8 *)((long)coder_ptr + 0x50) = 0;
            *(undefined4 *)((long)coder_ptr + 0x48) = 2;
            iVar6 = 2;
          }
          *in_pos = uVar8 + 1;
          break;
        case 2:
          lVar9 = *(long *)((long)coder_ptr + 0x50);
          uVar4 = (ulong)in[uVar8] << ((char)lVar9 * '\b' & 0x3fU) |
                  *(ulong *)((long)coder_ptr + 0x58);
          *(ulong *)((long)coder_ptr + 0x58) = uVar4;
          *in_pos = uVar8 + 1;
          uVar8 = lVar9 + 1;
          *(ulong *)((long)coder_ptr + 0x50) = uVar8;
          iVar6 = 2;
          if (7 < uVar8) {
            if ((*(char *)((long)coder_ptr + 0x4c) == '\x01') &&
               (uVar4 - 0x4000000000 < 0xffffffbfffffffff)) {
              return LZMA_FORMAT_ERROR;
            }
            uVar5 = lzma_lzma_decoder_memusage(options);
            uVar8 = uVar5 + 0x8000;
            *(ulong *)((long)coder_ptr + 0x68) = uVar8;
            *(undefined8 *)((long)coder_ptr + 0x50) = 0;
            *(undefined4 *)((long)coder_ptr + 0x48) = 3;
            goto LAB_0019dfc1;
          }
          break;
        case 3:
          uVar8 = *(ulong *)((long)coder_ptr + 0x68);
LAB_0019dfc1:
          if (*(ulong *)((long)coder_ptr + 0x60) < uVar8) {
            return LZMA_MEMLIMIT_ERROR;
          }
          filters[0].id = 0;
          filters[0].init = lzma_lzma_decoder_init;
          filters[1].options = (void *)0x0;
          filters[1].id = 0;
          filters[1].init = (lzma_init_function)0x0;
          filters[0].options = options;
          lVar3 = lzma_next_filter_init((lzma_next_coder *)coder_ptr,allocator,filters);
          if (lVar3 != LZMA_OK) {
            return lVar3;
          }
          lzma_lz_decoder_uncompressed(*coder_ptr,*(lzma_vli *)((long)coder_ptr + 0x58));
          *(undefined4 *)((long)coder_ptr + 0x48) = 4;
          iVar6 = 4;
          break;
        default:
          return LZMA_PROG_ERROR;
        }
      } while (iVar6 != 4);
    }
    lVar3 = (**(code **)((long)coder_ptr + 0x18))
                      (*coder_ptr,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
  }
  return lVar3;
}

Assistant:

static lzma_ret
alone_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_action action)
{
	lzma_alone_coder *coder = coder_ptr;

	while (*out_pos < out_size
			&& (coder->sequence == SEQ_CODE || *in_pos < in_size))
	switch (coder->sequence) {
	case SEQ_PROPERTIES:
		if (lzma_lzma_lclppb_decode(&coder->options, in[*in_pos]))
			return LZMA_FORMAT_ERROR;

		coder->sequence = SEQ_DICTIONARY_SIZE;
		++*in_pos;
		break;

	case SEQ_DICTIONARY_SIZE:
		coder->options.dict_size
				|= (size_t)(in[*in_pos]) << (coder->pos * 8);

		if (++coder->pos == 4) {
			if (coder->picky && coder->options.dict_size
					!= UINT32_MAX) {
				// A hack to ditch tons of false positives:
				// We allow only dictionary sizes that are
				// 2^n or 2^n + 2^(n-1). LZMA_Alone created
				// only files with 2^n, but accepts any
				// dictionary size.
				uint32_t d = coder->options.dict_size - 1;
				d |= d >> 2;
				d |= d >> 3;
				d |= d >> 4;
				d |= d >> 8;
				d |= d >> 16;
				++d;

				if (d != coder->options.dict_size)
					return LZMA_FORMAT_ERROR;
			}

			coder->pos = 0;
			coder->sequence = SEQ_UNCOMPRESSED_SIZE;
		}

		++*in_pos;
		break;

	case SEQ_UNCOMPRESSED_SIZE:
		coder->uncompressed_size
				|= (lzma_vli)(in[*in_pos]) << (coder->pos * 8);
		++*in_pos;
		if (++coder->pos < 8)
			break;

		// Another hack to ditch false positives: Assume that
		// if the uncompressed size is known, it must be less
		// than 256 GiB.
		if (coder->picky
				&& coder->uncompressed_size != LZMA_VLI_UNKNOWN
				&& coder->uncompressed_size
					>= (LZMA_VLI_C(1) << 38))
			return LZMA_FORMAT_ERROR;

		// Calculate the memory usage so that it is ready
		// for SEQ_CODER_INIT.
		coder->memusage = lzma_lzma_decoder_memusage(&coder->options)
				+ LZMA_MEMUSAGE_BASE;

		coder->pos = 0;
		coder->sequence = SEQ_CODER_INIT;

	// Fall through

	case SEQ_CODER_INIT: {
		if (coder->memusage > coder->memlimit)
			return LZMA_MEMLIMIT_ERROR;

		lzma_filter_info filters[2] = {
			{
				.init = &lzma_lzma_decoder_init,
				.options = &coder->options,
			}, {
				.init = NULL,
			}
		};

		const lzma_ret ret = lzma_next_filter_init(&coder->next,
				allocator, filters);
		if (ret != LZMA_OK)
			return ret;

		// Use a hack to set the uncompressed size.
		lzma_lz_decoder_uncompressed(coder->next.coder,
				coder->uncompressed_size);

		coder->sequence = SEQ_CODE;
		break;
	}

	case SEQ_CODE: {
		return coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);
	}

	default:
		return LZMA_PROG_ERROR;
	}

	return LZMA_OK;
}